

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_79::Input::consume(Input *this,ArrayPtr<const_char> expected)

{
  int iVar1;
  ulong __n;
  ArrayPtr<const_char> prefix;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  Fault f_1;
  ArrayPtr<const_char> expected_local;
  
  __n = expected.size_;
  expected_local.ptr = expected.ptr;
  _kjCondition.left = (this->wrapped).size_;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left >= __n;
  _kjCondition.right = __n;
  expected_local.size_ = __n;
  if (_kjCondition.left < __n) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              ((Fault *)&prefix,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x24a,FAILED,"wrapped.size() >= expected.size()","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal((Fault *)&prefix);
  }
  prefix.ptr = (this->wrapped).ptr;
  prefix.size_ = __n;
  if (__n == 0) {
    _kjCondition.result = true;
  }
  else {
    iVar1 = bcmp(prefix.ptr,expected_local.ptr,__n);
    _kjCondition.result = iVar1 == 0;
  }
  _kjCondition.left = (unsigned_long)&prefix;
  _kjCondition.right = (unsigned_long)&expected_local;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result != false) {
    advance(this,__n);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<char_const>&,kj::ArrayPtr<char_const>&>&,char_const(&)[34]>
            (&f_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x24d,FAILED,"prefix == expected","_kjCondition,\"Unexpected input in JSON message.\""
             ,(DebugComparison<kj::ArrayPtr<const_char>_&,_kj::ArrayPtr<const_char>_&> *)
              &_kjCondition,(char (*) [34])"Unexpected input in JSON message.");
  kj::_::Debug::Fault::fatal(&f_1);
}

Assistant:

void consume(kj::ArrayPtr<const char> expected) {
    KJ_REQUIRE(wrapped.size() >= expected.size());

    auto prefix = wrapped.first(expected.size());
    KJ_REQUIRE(prefix == expected, "Unexpected input in JSON message.");

    advance(expected.size());
  }